

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

int kwssys::SystemTools::Strucmp(char *l,char *r)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    iVar1 = tolower((int)l[lVar3]);
    iVar2 = tolower((int)r[lVar3]);
    if (iVar1 == 0) break;
    lVar3 = lVar3 + 1;
  } while (iVar1 == iVar2);
  return iVar1 - iVar2;
}

Assistant:

int SystemTools::Strucmp(const char* l, const char* r)
{
  int lc;
  int rc;
  do {
    lc = tolower(*l++);
    rc = tolower(*r++);
  } while (lc == rc && lc);
  return lc - rc;
}